

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O0

void bitset_container_set_range(bitset_container_t *bitset,uint32_t begin,uint32_t end)

{
  int iVar1;
  uint32_t in_EDX;
  uint32_t in_ESI;
  int *in_RDI;
  bitset_container_t *in_stack_ffffffffffffffe8;
  
  bitset_set_range(*(uint64_t **)(in_RDI + 2),in_ESI,in_EDX);
  iVar1 = bitset_container_compute_cardinality(in_stack_ffffffffffffffe8);
  *in_RDI = iVar1;
  return;
}

Assistant:

void bitset_container_set_range(bitset_container_t *bitset, uint32_t begin,
                                uint32_t end) {
    bitset_set_range(bitset->words, begin, end);
    bitset->cardinality =
        bitset_container_compute_cardinality(bitset);  // could be smarter
}